

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe_non_zero_test(secp256k1_fe *fe)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *r;
  undefined1 *puVar2;
  uint64_t *puVar3;
  int *piVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_EAX;
  uint32_t uVar13;
  secp256k1_gej *psVar14;
  secp256k1_scratch_space *scratch;
  code *pcVar15;
  byte bVar16;
  secp256k1_gej *in_RCX;
  uint extraout_EDX;
  uint count;
  secp256k1_gej *a;
  long extraout_RDX;
  ulong uVar17;
  long extraout_RDX_00;
  secp256k1_ge *scratch_00;
  size_t sVar18;
  secp256k1_gej *r_00;
  uint64_t *t;
  secp256k1_ge *r_01;
  uint uVar19;
  secp256k1_gej *psVar20;
  secp256k1_ge *psVar21;
  secp256k1_strauss_point_state *psVar22;
  uchar *out32;
  secp256k1_sha256 *psVar23;
  secp256k1_gej *in_RSI;
  secp256k1_gej *psVar24;
  secp256k1_ge *psVar25;
  ulong uVar26;
  secp256k1_ge *psVar27;
  secp256k1_gej *psVar28;
  secp256k1_gej *psVar29;
  ulong uVar30;
  ulong uVar31;
  secp256k1_ge *a_00;
  ulong uVar32;
  code *cb;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar33;
  secp256k1_fe *psVar34;
  secp256k1_ge *psVar35;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar36;
  secp256k1_gej *unaff_R13;
  long lVar37;
  secp256k1_ge *r_02;
  long lVar38;
  secp256k1_ge *r_03;
  secp256k1_scalar *psVar39;
  secp256k1_ge *r_04;
  secp256k1_ge *a_01;
  secp256k1_sha256 *psVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  ulong uStack_2c90;
  secp256k1_strauss_state sStack_2c88;
  secp256k1_strauss_point_state sStack_2c70;
  secp256k1_fe asStack_2860 [8];
  secp256k1_ge asStack_26e0 [8];
  secp256k1_gej *psStack_2398;
  secp256k1_callback *psStack_2390;
  secp256k1_ge *psStack_2380;
  secp256k1_strauss_point_state *psStack_2378;
  secp256k1_scalar *psStack_2370;
  undefined1 auStack_2358 [8];
  undefined1 auStack_2350 [176];
  secp256k1_gej sStack_22a0;
  secp256k1_gej sStack_2208;
  secp256k1_gej sStack_2170;
  secp256k1_gej sStack_20d8;
  secp256k1_gej sStack_2040;
  secp256k1_gej asStack_1fa8 [2];
  secp256k1_gej asStack_1e28 [5];
  secp256k1_strauss_point_state sStack_1ae8;
  secp256k1_scratch_space *psStack_16d0;
  secp256k1_sha256 *psStack_16c8;
  undefined1 *puStack_16c0;
  secp256k1_gej *psStack_16b8;
  secp256k1_gej *psStack_16b0;
  code *pcStack_16a8;
  undefined4 uStack_1696;
  undefined2 uStack_1692;
  secp256k1_gej *psStack_1690;
  long lStack_1688;
  undefined1 auStack_1680 [40];
  undefined8 uStack_1658;
  uint64_t uStack_1650;
  uint64_t uStack_1648;
  secp256k1_sha256 sStack_1640;
  secp256k1_sha256 sStack_15d0;
  secp256k1_gej *psStack_1568;
  secp256k1_ge *psStack_1560;
  secp256k1_ge *psStack_1558;
  secp256k1_ge *psStack_1550;
  secp256k1_gej *psStack_1548;
  secp256k1_strauss_point_state *psStack_1540;
  undefined1 auStack_1538 [32];
  undefined1 auStack_1518 [40];
  secp256k1_ge *psStack_14f0;
  secp256k1_strauss_point_state *psStack_14e8;
  secp256k1_gej sStack_14e0;
  secp256k1_gej sStack_1448;
  secp256k1_gej sStack_13b0;
  secp256k1_ge sStack_1318;
  secp256k1_gej sStack_12b0;
  secp256k1_ge asStack_1218 [3];
  secp256k1_ge asStack_1098 [8];
  secp256k1_strauss_point_state sStack_d58;
  secp256k1_ge *psStack_940;
  secp256k1_ge *psStack_938;
  secp256k1_ge *psStack_930;
  ulong uStack_928;
  secp256k1_ge *psStack_920;
  code *pcStack_918;
  code *pcStack_910;
  uint uStack_8fc;
  int iStack_8f8;
  int iStack_8f4;
  secp256k1_ge *psStack_8f0;
  ulong uStack_8e8;
  secp256k1_ge *psStack_8e0;
  secp256k1_ge *psStack_8d8;
  secp256k1_ge *psStack_8d0;
  secp256k1_ge *psStack_8c8;
  secp256k1_ge *psStack_8c0;
  secp256k1_ge *psStack_8b8;
  uint uStack_8a4;
  undefined1 auStack_8a0 [56];
  ulong uStack_868;
  ulong uStack_860;
  ulong uStack_858;
  ulong uStack_850;
  ulong uStack_848;
  undefined1 auStack_840 [72];
  uint64_t uStack_7f8;
  uint64_t uStack_7f0;
  uint64_t uStack_7e8;
  ulong uStack_7e0;
  ulong uStack_7d8;
  secp256k1_ge *psStack_7c8;
  secp256k1_ge *psStack_7c0;
  uint64_t uStack_7b8;
  uint64_t uStack_7b0;
  uint64_t uStack_7a8;
  uint64_t uStack_7a0;
  uint64_t uStack_798;
  uint64_t uStack_790;
  uint64_t uStack_788;
  uint64_t uStack_780;
  uint64_t uStack_778;
  undefined1 auStack_770 [56];
  uint64_t uStack_738;
  uint64_t uStack_730;
  uint64_t uStack_728;
  secp256k1_ge *psStack_720;
  uint uStack_718;
  secp256k1_ge sStack_700;
  secp256k1_ge sStack_690;
  secp256k1_gej sStack_620;
  secp256k1_fe *psStack_588;
  secp256k1_ge *psStack_580;
  secp256k1_ge *psStack_578;
  secp256k1_ge *psStack_570;
  secp256k1_ge *psStack_568;
  secp256k1_ge *psStack_560;
  undefined1 auStack_550 [92];
  int iStack_4f4;
  undefined1 auStack_4f0 [100];
  int iStack_48c;
  secp256k1_ge sStack_488;
  secp256k1_gej *psStack_420;
  secp256k1_gej *psStack_418;
  secp256k1_fe *psStack_410;
  undefined1 *puStack_408;
  secp256k1_fe *psStack_400;
  secp256k1_fe *psStack_3f8;
  secp256k1_gej sStack_3f0;
  int *piStack_350;
  secp256k1_gej *psStack_348;
  long lStack_340;
  secp256k1_gej *psStack_338;
  code *pcStack_330;
  secp256k1_gej *psStack_328;
  undefined1 auStack_320 [88];
  undefined8 uStack_2c8;
  secp256k1_gej *psStack_2b8;
  uint64_t uStack_2b0;
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_fe *psStack_270;
  secp256k1_fe *psStack_268;
  secp256k1_gej *psStack_260;
  secp256k1_gej *psStack_258;
  undefined1 auStack_250 [56];
  uint64_t uStack_218;
  uint64_t uStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  int iStack_1f8;
  undefined1 auStack_1f0 [56];
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  int iStack_198;
  undefined1 auStack_190 [56];
  secp256k1_gej *psStack_158;
  secp256k1_gej *psStack_150;
  secp256k1_gej *psStack_148;
  ulong uStack_140;
  ulong uStack_138;
  secp256k1_fe sStack_130;
  secp256k1_fe sStack_100;
  secp256k1_fe sStack_d0;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  uint64_t uStack_90;
  uint64_t uStack_88;
  uint64_t uStack_80;
  undefined8 uStack_78;
  secp256k1_fe sStack_68;
  secp256k1_fe *psStack_38;
  
  bVar10 = 0;
  while( true ) {
    testutil_random_fe_test(fe);
    psVar14 = (secp256k1_gej *)fe;
    secp256k1_fe_verify(fe);
    if (fe->normalized == 0) break;
    if (((fe->n[3] != 0 || fe->n[1] != 0) || (fe->n[2] != 0 || fe->n[0] != 0)) || fe->n[4] != 0) {
      return;
    }
  }
  testutil_random_fe_non_zero_test_cold_1();
  uStack_2c8._0_4_ = 0x14bd3f;
  uStack_2c8._4_4_ = 0;
  psVar24 = in_RSI;
  psStack_38 = fe;
  secp256k1_gej_verify(in_RSI);
  uStack_2c8._0_4_ = 0x14bd47;
  uStack_2c8._4_4_ = 0;
  psVar28 = a;
  secp256k1_gej_verify(a);
  if (in_RSI->infinity == 0) {
    if (a->infinity != 0) {
      psVar20 = in_RSI;
      if (in_RCX != (secp256k1_gej *)0x0) {
        (in_RCX->x).n[0] = 1;
        (in_RCX->x).n[1] = 0;
        (in_RCX->x).n[2] = 0;
        (in_RCX->x).n[3] = 0;
        (in_RCX->x).n[4] = 0;
        (in_RCX->x).magnitude = 1;
        (in_RCX->x).normalized = 1;
        uStack_2c8._0_4_ = 0x14bd9f;
        uStack_2c8._4_4_ = 0;
        secp256k1_fe_verify(&in_RCX->x);
      }
      goto LAB_0014bdaa;
    }
    psVar34 = &a->z;
    uStack_2c8._0_4_ = 0x14bde1;
    uStack_2c8._4_4_ = 0;
    psStack_2b8 = psVar14;
    psStack_2a0 = in_RCX;
    secp256k1_fe_sqr(&sStack_68,psVar34);
    psVar1 = &in_RSI->z;
    uStack_2c8._0_4_ = 0x14bdf8;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_sqr(&sStack_d0,psVar1);
    uStack_2c8._0_4_ = 0x14be0b;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul(&sStack_130,&in_RSI->x,&sStack_68);
    uStack_2c8._0_4_ = 0x14be1e;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_1f0 + 0x30),&a->x,&sStack_d0);
    uStack_2c8._0_4_ = 0x14be3a;
    uStack_2c8._4_4_ = 0;
    psStack_298 = in_RSI;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1f0,&in_RSI->y,&sStack_68);
    uStack_2c8._0_4_ = 0x14be4d;
    uStack_2c8._4_4_ = 0;
    psStack_270 = psVar34;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1f0,(secp256k1_fe *)auStack_1f0,psVar34);
    uStack_2c8._0_4_ = 0x14be6c;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul(&sStack_100,&a->y,&sStack_d0);
    unaff_R13 = (secp256k1_gej *)0x3ffffbfffff0bc;
    uStack_2c8._0_4_ = 0x14be89;
    uStack_2c8._4_4_ = 0;
    psStack_268 = psVar1;
    secp256k1_fe_mul(&sStack_100,&sStack_100,psVar1);
    uStack_2c8._0_4_ = 0x14be99;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&sStack_130);
    psVar24 = (secp256k1_gej *)0x1;
    uStack_2c8._0_4_ = 0x14bea6;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&sStack_130,1);
    psVar14 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_130.n[0]);
    psVar20 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_130.n[1]);
    in_RSI = (secp256k1_gej *)(0x3ffffffffffffc - sStack_130.n[2]);
    in_RCX = (secp256k1_gej *)(0x3ffffffffffffc - sStack_130.n[3]);
    uStack_2a8 = 0x3fffffffffffc - sStack_130.n[4];
    uStack_138 = 2;
    uStack_2c8._0_4_ = 0x14bf12;
    uStack_2c8._4_4_ = 0;
    auStack_190._48_8_ = psVar14;
    psStack_158 = psVar20;
    psStack_150 = in_RSI;
    psStack_148 = in_RCX;
    uStack_140 = uStack_2a8;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_190 + 0x30));
    uStack_2c8._0_4_ = 0x14bf1a;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_190 + 0x30));
    unaff_R12 = (secp256k1_gej *)(auStack_1f0 + 0x30);
    uStack_2c8._0_4_ = 0x14bf2a;
    uStack_2c8._4_4_ = 0;
    psVar28 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x1e < iStack_198) goto LAB_0014c5f6;
    psStack_260 = (secp256k1_gej *)((long)(psVar14->x).n + auStack_1f0._48_8_);
    psStack_258 = (secp256k1_gej *)((long)(psVar20->x).n + uStack_1b8);
    psStack_280 = (secp256k1_gej *)((long)(in_RSI->x).n + uStack_1b0);
    psStack_278 = (secp256k1_gej *)((long)(in_RCX->x).n + uStack_1a8);
    uStack_2a8 = uStack_2a8 + uStack_1a0;
    uStack_138 = (ulong)(iStack_198 + 2);
    uStack_2c8._0_4_ = 0x14bfab;
    uStack_2c8._4_4_ = 0;
    auStack_190._48_8_ = psStack_260;
    psStack_158 = psStack_258;
    psStack_150 = psStack_280;
    psStack_148 = psStack_278;
    uStack_140 = uStack_2a8;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_190 + 0x30));
    uStack_2c8._0_4_ = 0x14bfbb;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&sStack_100);
    psVar24 = (secp256k1_gej *)0x1;
    uStack_2c8._0_4_ = 0x14bfc8;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify_magnitude(&sStack_100,1);
    in_RSI = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_100.n[0]);
    unaff_R13 = (secp256k1_gej *)auStack_190;
    in_RCX = (secp256k1_gej *)(0x3ffffffffffffc - sStack_100.n[1]);
    psVar14 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_100.n[2]);
    uStack_2b0 = 0x3ffffffffffffc - sStack_100.n[3];
    psVar20 = (secp256k1_gej *)(0x3fffffffffffc - sStack_100.n[4]);
    auStack_190._40_8_ = 2;
    uStack_2c8._0_4_ = 0x14c02e;
    uStack_2c8._4_4_ = 0;
    auStack_190._0_8_ = in_RSI;
    auStack_190._8_8_ = in_RCX;
    auStack_190._16_8_ = psVar14;
    auStack_190._24_8_ = uStack_2b0;
    auStack_190._32_8_ = psVar20;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    uStack_2c8._0_4_ = 0x14c036;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    unaff_R12 = (secp256k1_gej *)auStack_1f0;
    uStack_2c8._0_4_ = 0x14c046;
    uStack_2c8._4_4_ = 0;
    psVar28 = unaff_R12;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R12);
    if (0x1e < (int)auStack_1f0._40_4_) goto LAB_0014c5fb;
    psStack_288 = (secp256k1_gej *)((long)(in_RSI->x).n + auStack_1f0._0_8_);
    psVar28 = (secp256k1_gej *)((long)(in_RCX->x).n + auStack_1f0._8_8_);
    psVar24 = (secp256k1_gej *)((long)(psVar14->x).n + auStack_1f0._16_8_);
    uStack_2b0 = uStack_2b0 + auStack_1f0._24_8_;
    psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + auStack_1f0._32_8_);
    auStack_190._44_4_ = 0;
    auStack_190._40_4_ = auStack_1f0._40_4_ + 2;
    uStack_2c8._0_4_ = 0x14c0d4;
    uStack_2c8._4_4_ = 0;
    psStack_290 = psVar20;
    auStack_190._0_8_ = psStack_288;
    auStack_190._8_8_ = psVar28;
    auStack_190._16_8_ = psVar24;
    auStack_190._24_8_ = uStack_2b0;
    auStack_190._32_8_ = psVar20;
    secp256k1_fe_verify((secp256k1_fe *)auStack_190);
    uStack_2c8._0_4_ = 0x14c0e1;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_190 + 0x30));
    psVar14 = psStack_2b8;
    uVar30 = (uStack_2a8 >> 0x30) * 0x1000003d1 + (long)psStack_260;
    if (((uVar30 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar30 & 0xfffffffffffff) == 0)) {
      psVar20 = (secp256k1_gej *)0xffffffffffff;
      uVar32 = (long)(psStack_258->x).n + (uVar30 >> 0x34);
      uVar17 = (long)(psStack_280->x).n + (uVar32 >> 0x34);
      uVar26 = (long)(psStack_278->x).n + (uVar17 >> 0x34);
      uVar31 = (uVar26 >> 0x34) + (uStack_2a8 & 0xffffffffffff);
      if ((((uVar32 | uVar30 | uVar17 | uVar26) & 0xfffffffffffff) == 0 && uVar31 == 0) ||
         (((uVar30 | 0x1000003d0) & uVar32 & uVar17 & uVar26 & (uVar31 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        uStack_2c8._0_4_ = 0x14c4ed;
        uStack_2c8._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_190);
        uVar30 = ((ulong)psStack_290 >> 0x30) * 0x1000003d1 + (long)psStack_288;
        if (((uVar30 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar30 & 0xfffffffffffff) == 0)) {
          uVar32 = (long)(psVar28->x).n + (uVar30 >> 0x34);
          uVar17 = (long)(psVar24->x).n + (uVar32 >> 0x34);
          uVar26 = (uVar17 >> 0x34) + uStack_2b0;
          uVar31 = (uVar26 >> 0x34) + ((ulong)psStack_290 & 0xffffffffffff);
          if ((((uVar32 | uVar30 | uVar17 | uVar26) & 0xfffffffffffff) == 0 && uVar31 == 0) ||
             (((uVar30 | 0x1000003d0) & uVar32 & uVar17 & uVar26 & (uVar31 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            uStack_2c8._0_4_ = 0x14c5df;
            uStack_2c8._4_4_ = 0;
            secp256k1_gej_double_var(psStack_2b8,psStack_298,&psStack_2a0->x);
            return;
          }
        }
        if (psStack_2a0 != (secp256k1_gej *)0x0) {
          *(undefined1 (*) [16])((long)(psStack_2a0->x).n + 0x1c) = (undefined1  [16])0x0;
          (psStack_2a0->x).n[2] = 0;
          (psStack_2a0->x).n[3] = 0;
          (psStack_2a0->x).n[0] = 0;
          (psStack_2a0->x).n[1] = 0;
          (psStack_2a0->x).normalized = 1;
          uStack_2c8._0_4_ = 0x14c5c1;
          uStack_2c8._4_4_ = 0;
          secp256k1_fe_verify(&psStack_2a0->x);
        }
        uStack_2c8._0_4_ = 0x14c5cb;
        uStack_2c8._4_4_ = 0;
        secp256k1_gej_set_infinity(psStack_2b8);
        return;
      }
    }
    psStack_2b8->infinity = 0;
    uStack_2c8._0_4_ = 0x14c1cd;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)auStack_250,(secp256k1_fe *)(auStack_190 + 0x30),psStack_270);
    if (psStack_2a0 != (secp256k1_gej *)0x0) {
      (psStack_2a0->x).n[4] = auStack_250._32_8_;
      (psStack_2a0->x).magnitude = auStack_250._40_4_;
      (psStack_2a0->x).normalized = auStack_250._44_4_;
      (psStack_2a0->x).n[2] = auStack_250._16_8_;
      (psStack_2a0->x).n[3] = auStack_250._24_8_;
      (psStack_2a0->x).n[0] = auStack_250._0_8_;
      (psStack_2a0->x).n[1] = auStack_250._8_8_;
    }
    in_RCX = (secp256k1_gej *)auStack_250;
    uStack_2c8._0_4_ = 0x14c20d;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul(&psVar14->z,psStack_268,(secp256k1_fe *)in_RCX);
    in_RSI = (secp256k1_gej *)&uStack_a0;
    unaff_R12 = (secp256k1_gej *)(auStack_190 + 0x30);
    uStack_2c8._0_4_ = 0x14c228;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_sqr((secp256k1_fe *)in_RSI,(secp256k1_fe *)unaff_R12);
    uStack_2c8._0_4_ = 0x14c230;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    uStack_2c8._0_4_ = 0x14c23d;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)in_RSI,1);
    uStack_a0 = 0x3ffffbfffff0bc - uStack_a0;
    uStack_98 = 0x3ffffffffffffc - uStack_98;
    uStack_90 = 0x3ffffffffffffc - uStack_90;
    uStack_88 = 0x3ffffffffffffc - uStack_88;
    uStack_80 = 0x3fffffffffffc - uStack_80;
    uStack_78._0_4_ = 2;
    uStack_78._4_4_ = 0;
    uStack_2c8._0_4_ = 0x14c285;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    unaff_R13 = (secp256k1_gej *)(auStack_250 + 0x30);
    uStack_2c8._0_4_ = 0x14c29b;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)unaff_R13,(secp256k1_fe *)in_RSI,(secp256k1_fe *)unaff_R12);
    uStack_2c8._0_4_ = 0x14c2ae;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)in_RCX,&sStack_130,(secp256k1_fe *)in_RSI);
    psVar24 = (secp256k1_gej *)auStack_190;
    uStack_2c8._0_4_ = 0x14c2be;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_sqr(&psVar14->x,(secp256k1_fe *)psVar24);
    uStack_2c8._0_4_ = 0x14c2c6;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    uStack_2c8._0_4_ = 0x14c2ce;
    uStack_2c8._4_4_ = 0;
    psVar28 = unaff_R13;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R13);
    iVar11 = iStack_1f8 + (psVar14->x).magnitude;
    if (0x20 < iVar11) goto LAB_0014c600;
    uVar5 = (psVar14->x).n[1];
    uVar6 = (psVar14->x).n[2];
    uVar7 = (psVar14->x).n[3];
    (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_250._48_8_;
    (psVar14->x).n[1] = uVar5 + uStack_218;
    (psVar14->x).n[2] = uVar6 + uStack_210;
    (psVar14->x).n[3] = uVar7 + uStack_208;
    puVar3 = (psVar14->x).n + 4;
    *puVar3 = *puVar3 + uStack_200;
    (psVar14->x).magnitude = iVar11;
    (psVar14->x).normalized = 0;
    uStack_2c8._0_4_ = 0x14c320;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    uStack_2c8._0_4_ = 0x14c328;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    in_RCX = (secp256k1_gej *)auStack_250;
    uStack_2c8._0_4_ = 0x14c335;
    uStack_2c8._4_4_ = 0;
    psVar28 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    iVar11 = auStack_250._40_4_ + (psVar14->x).magnitude;
    if (0x20 < iVar11) goto LAB_0014c605;
    uVar5 = (psVar14->x).n[1];
    uVar6 = (psVar14->x).n[2];
    uVar7 = (psVar14->x).n[3];
    in_RCX = (secp256k1_gej *)auStack_250;
    (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_250._0_8_;
    (psVar14->x).n[1] = uVar5 + auStack_250._8_8_;
    (psVar14->x).n[2] = uVar6 + auStack_250._16_8_;
    (psVar14->x).n[3] = uVar7 + auStack_250._24_8_;
    puVar3 = (psVar14->x).n + 4;
    *puVar3 = *puVar3 + auStack_250._32_8_;
    (psVar14->x).magnitude = iVar11;
    (psVar14->x).normalized = 0;
    uStack_2c8._0_4_ = 0x14c381;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    uStack_2c8._0_4_ = 0x14c389;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    uStack_2c8._0_4_ = 0x14c391;
    uStack_2c8._4_4_ = 0;
    psVar28 = in_RCX;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    iVar11 = auStack_250._40_4_ + (psVar14->x).magnitude;
    if (0x20 < iVar11) goto LAB_0014c60a;
    uVar5 = (psVar14->x).n[1];
    uVar6 = (psVar14->x).n[2];
    uVar7 = (psVar14->x).n[3];
    in_RCX = (secp256k1_gej *)auStack_250;
    (psVar14->x).n[0] = (psVar14->x).n[0] + auStack_250._0_8_;
    (psVar14->x).n[1] = uVar5 + auStack_250._8_8_;
    (psVar14->x).n[2] = uVar6 + auStack_250._16_8_;
    (psVar14->x).n[3] = uVar7 + auStack_250._24_8_;
    puVar3 = (psVar14->x).n + 4;
    *puVar3 = *puVar3 + auStack_250._32_8_;
    (psVar14->x).magnitude = iVar11;
    (psVar14->x).normalized = 0;
    uStack_2c8._0_4_ = 0x14c3dd;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify(&psVar14->x);
    uStack_2c8._0_4_ = 0x14c3e5;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    uStack_2c8._0_4_ = 0x14c3ed;
    uStack_2c8._4_4_ = 0;
    psVar28 = psVar14;
    secp256k1_fe_verify(&psVar14->x);
    iVar11 = (psVar14->x).magnitude + auStack_250._40_4_;
    if (0x20 < iVar11) goto LAB_0014c60f;
    auStack_250._0_8_ = (psVar14->x).n[0] + auStack_250._0_8_;
    auStack_250._8_8_ = (psVar14->x).n[1] + auStack_250._8_8_;
    auStack_250._16_8_ = (psVar14->x).n[2] + auStack_250._16_8_;
    auStack_250._24_8_ = (psVar14->x).n[3] + auStack_250._24_8_;
    auStack_250._32_8_ = auStack_250._32_8_ + (psVar14->x).n[4];
    auStack_250._44_4_ = 0;
    uStack_2c8._0_4_ = 0x14c43d;
    uStack_2c8._4_4_ = 0;
    auStack_250._40_4_ = iVar11;
    secp256k1_fe_verify((secp256k1_fe *)auStack_250);
    in_RCX = (secp256k1_gej *)&psVar14->y;
    uStack_2c8._0_4_ = 0x14c454;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_mul((secp256k1_fe *)in_RCX,(secp256k1_fe *)auStack_250,(secp256k1_fe *)auStack_190)
    ;
    in_RSI = (secp256k1_gej *)(auStack_250 + 0x30);
    uStack_2c8._0_4_ = 0x14c46f;
    uStack_2c8._4_4_ = 0;
    psVar24 = in_RSI;
    secp256k1_fe_mul((secp256k1_fe *)in_RSI,(secp256k1_fe *)in_RSI,(secp256k1_fe *)auStack_1f0);
    uStack_2c8._0_4_ = 0x14c477;
    uStack_2c8._4_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)in_RCX);
    uStack_2c8._0_4_ = 0x14c47f;
    uStack_2c8._4_4_ = 0;
    psVar28 = in_RSI;
    secp256k1_fe_verify((secp256k1_fe *)in_RSI);
    iStack_1f8 = iStack_1f8 + (psVar14->y).magnitude;
    if (iStack_1f8 < 0x21) {
      uVar5 = (psVar14->y).n[1];
      uVar6 = (psVar14->y).n[2];
      uVar7 = (psVar14->y).n[3];
      (psVar14->y).n[0] = (psVar14->y).n[0] + auStack_250._48_8_;
      (psVar14->y).n[1] = uVar5 + uStack_218;
      (psVar14->y).n[2] = uVar6 + uStack_210;
      (psVar14->y).n[3] = uVar7 + uStack_208;
      puVar3 = (psVar14->y).n + 4;
      *puVar3 = *puVar3 + uStack_200;
      (psVar14->y).magnitude = iStack_1f8;
      (psVar14->y).normalized = 0;
      uStack_2c8._0_4_ = 0x14c4d3;
      uStack_2c8._4_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)in_RCX);
      uStack_2c8._0_4_ = 0x14c4db;
      uStack_2c8._4_4_ = 0;
      secp256k1_gej_verify(psVar14);
      return;
    }
  }
  else {
    psVar20 = a;
    if (in_RCX == (secp256k1_gej *)0x0) {
LAB_0014bdaa:
      memcpy(psVar14,psVar20,0x98);
      return;
    }
    uStack_2c8._0_4_ = 0x14c5f6;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_1();
LAB_0014c5f6:
    uStack_2c8._0_4_ = 0x14c5fb;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_8();
LAB_0014c5fb:
    uStack_2c8._0_4_ = 0x14c600;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_7();
LAB_0014c600:
    uStack_2c8._0_4_ = 0x14c605;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_6();
LAB_0014c605:
    uStack_2c8._0_4_ = 0x14c60a;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_5();
LAB_0014c60a:
    uStack_2c8._0_4_ = 0x14c60f;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_4();
LAB_0014c60f:
    uStack_2c8._0_4_ = 0x14c614;
    uStack_2c8._4_4_ = 0;
    secp256k1_gej_add_var_cold_3();
  }
  uStack_2c8 = secp256k1_ge_set_all_gej_var;
  secp256k1_gej_add_var_cold_2();
  psVar33 = psVar24;
  lVar37 = extraout_RDX;
  psStack_328 = psVar28;
  auStack_320._48_8_ = psVar14;
  auStack_320._56_8_ = unaff_R12;
  auStack_320._64_8_ = unaff_R13;
  auStack_320._72_8_ = in_RCX;
  auStack_320._80_8_ = in_RSI;
  uStack_2c8 = (code *)psVar20;
  if (extraout_RDX == 0) {
    return;
  }
  do {
    pcStack_330 = (code *)0x14c648;
    secp256k1_gej_verify(psVar33);
    lVar37 = lVar37 + -1;
    psVar33 = psVar33 + 1;
  } while (lVar37 != 0);
  psVar34 = &psVar24->z;
  lVar38 = -1;
  lVar37 = 0;
  psVar14 = psStack_328;
  do {
    if ((int)psVar34[1].n[0] == 0) {
      if (lVar38 == -1) {
        uVar7 = psVar34->n[0];
        uVar8 = psVar34->n[1];
        uVar5 = psVar34->n[2];
        uVar6 = psVar34->n[3];
        iVar11 = psVar34->magnitude;
        iVar9 = psVar34->normalized;
        (psVar14->x).n[4] = psVar34->n[4];
        (psVar14->x).magnitude = iVar11;
        (psVar14->x).normalized = iVar9;
        (psVar14->x).n[2] = uVar5;
        (psVar14->x).n[3] = uVar6;
        (psVar14->x).n[0] = uVar7;
        (psVar14->x).n[1] = uVar8;
        lVar38 = lVar37;
      }
      else {
        pcStack_330 = (code *)0x14c690;
        secp256k1_fe_mul(&psVar14->x,(secp256k1_fe *)((long)&psStack_328->x + lVar38 * 0x68),psVar34
                        );
        lVar38 = lVar37;
      }
    }
    else {
      pcStack_330 = (code *)0x14c675;
      secp256k1_ge_set_infinity((secp256k1_ge *)psVar14);
    }
    psVar28 = psStack_328;
    lVar37 = lVar37 + 1;
    psVar14 = (secp256k1_gej *)((psVar14->z).n + 1);
    psVar34 = (secp256k1_fe *)(psVar34[3].n + 1);
  } while (extraout_RDX != lVar37);
  if (lVar38 == -1) {
    return;
  }
  psVar34 = (secp256k1_fe *)(lVar38 * 0x68);
  psVar14 = (secp256k1_gej *)((long)&psStack_328->x + (long)psVar34);
  psVar20 = (secp256k1_gej *)auStack_320;
  pcStack_330 = (code *)0x14c6e8;
  secp256k1_fe_inv_var((secp256k1_fe *)psVar20,(secp256k1_fe *)psVar14);
  if (lVar38 == 0) {
    lVar38 = 0;
    psVar33 = psVar28;
  }
  else {
    lVar37 = lVar38 + -1;
    psVar33 = (secp256k1_gej *)&psVar24[lVar38 + -1].infinity;
    psVar34 = (secp256k1_fe *)((long)(psVar28->x).n + (long)psVar34 + -0x68);
    do {
      if ((int)(psVar33->x).n[0] == 0) {
        pcStack_330 = (code *)0x14c726;
        secp256k1_fe_mul((secp256k1_fe *)((long)&psStack_328->x + lVar38 * 0x68),psVar34,
                         (secp256k1_fe *)auStack_320);
        psVar14 = (secp256k1_gej *)auStack_320;
        pcStack_330 = (code *)0x14c742;
        psVar20 = psVar14;
        secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,&psVar24[lVar38].z);
        lVar38 = lVar37;
      }
      psVar33 = psVar33 + -1;
      psVar34 = (secp256k1_fe *)&psVar34[-3].magnitude;
      bVar41 = lVar37 != 0;
      lVar37 = lVar37 + -1;
    } while (bVar41);
  }
  psVar28 = psStack_328;
  if (psVar24[lVar38].infinity == 0) {
    lVar38 = lVar38 * 0x68;
    puVar3 = (uint64_t *)((long)&psStack_328->y + lVar38 + -0x10);
    *puVar3 = auStack_320._32_8_;
    puVar3[1] = auStack_320._40_8_;
    puVar3 = (uint64_t *)((long)&psStack_328->x + lVar38 + 0x10);
    *puVar3 = auStack_320._16_8_;
    puVar3[1] = auStack_320._24_8_;
    puVar3 = (uint64_t *)((long)&psStack_328->x + lVar38);
    *puVar3 = auStack_320._0_8_;
    puVar3[1] = auStack_320._8_8_;
    psVar14 = psStack_328;
    lVar37 = extraout_RDX;
    if (extraout_RDX == 0) {
      return;
    }
    do {
      if (psVar24->infinity == 0) {
        pcStack_330 = (code *)0x14c7b8;
        secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar14,psVar24,&psVar14->x);
      }
      psVar24 = psVar24 + 1;
      lVar37 = lVar37 + -1;
      lVar38 = extraout_RDX;
      psVar14 = (secp256k1_gej *)((psVar14->z).n + 1);
    } while (lVar37 != 0);
    do {
      pcStack_330 = (code *)0x14c7d0;
      secp256k1_ge_verify((secp256k1_ge *)psVar28);
      psVar28 = (secp256k1_gej *)((psVar28->z).n + 1);
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
    return;
  }
  pcStack_330 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  psVar28 = &sStack_3f0;
  psVar29 = &sStack_3f0;
  psStack_3f8 = (secp256k1_fe *)0x14c817;
  piStack_350 = (int *)psVar34;
  psStack_348 = psVar33;
  lStack_340 = lVar38;
  psStack_338 = psVar24;
  pcStack_330 = (code *)lVar37;
  memcpy(&sStack_3f0,psVar20,0x98);
  psStack_3f8 = (secp256k1_fe *)0x14c81f;
  secp256k1_gej_verify(&sStack_3f0);
  psStack_3f8 = (secp256k1_fe *)0x14c827;
  secp256k1_gej_verify(psVar14);
  psStack_3f8 = (secp256k1_fe *)0x14c834;
  secp256k1_fe_cmov(&sStack_3f0.x,&psVar14->x,0);
  psVar34 = &psVar14->y;
  psStack_3f8 = (secp256k1_fe *)0x14c847;
  secp256k1_fe_cmov(&sStack_3f0.y,psVar34,0);
  r = &sStack_3f0.z;
  psVar1 = &psVar14->z;
  psStack_3f8 = (secp256k1_fe *)0x14c85d;
  secp256k1_fe_cmov(r,psVar1,0);
  psStack_3f8 = (secp256k1_fe *)0x14c865;
  secp256k1_gej_verify(&sStack_3f0);
  psStack_3f8 = (secp256k1_fe *)0x14c870;
  psVar24 = psVar20;
  iVar11 = gej_xyz_equals_gej(&sStack_3f0,psVar20);
  if (iVar11 == 0) {
    psStack_3f8 = (secp256k1_fe *)0x14c907;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_3f8 = (secp256k1_fe *)0x14c883;
    secp256k1_gej_verify(&sStack_3f0);
    psStack_3f8 = (secp256k1_fe *)0x14c88b;
    secp256k1_gej_verify(psVar14);
    psStack_3f8 = (secp256k1_fe *)0x14c89b;
    secp256k1_fe_cmov(&sStack_3f0.x,&psVar14->x,1);
    psStack_3f8 = (secp256k1_fe *)0x14c8ad;
    secp256k1_fe_cmov(&sStack_3f0.y,psVar34,1);
    psStack_3f8 = (secp256k1_fe *)0x14c8bd;
    secp256k1_fe_cmov(r,psVar1,1);
    sStack_3f0.infinity = sStack_3f0.infinity & 0xfffffffeU | psVar14->infinity & 1U;
    psStack_3f8 = (secp256k1_fe *)0x14c8e1;
    secp256k1_gej_verify(&sStack_3f0);
    psStack_3f8 = (secp256k1_fe *)0x14c8ec;
    psVar24 = psVar14;
    iVar11 = gej_xyz_equals_gej(&sStack_3f0,psVar14);
    psVar28 = psVar29;
    if (iVar11 != 0) {
      return;
    }
  }
  psStack_3f8 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_3f8 = psVar1;
  psStack_400 = psVar34;
  puStack_408 = (undefined1 *)&sStack_3f0;
  psStack_410 = r;
  psStack_418 = psVar20;
  psStack_420 = psVar14;
  if ((*(int *)((long)psVar28 + 0x90) != psVar24->infinity) || (*(int *)((long)psVar28 + 0x90) != 0)
     ) {
    return;
  }
  r_02 = (secp256k1_ge *)(auStack_4f0 + 0x38);
  psStack_560 = (secp256k1_ge *)0x14c959;
  memcpy(r_02,psVar28,0x98);
  psVar21 = (secp256k1_ge *)auStack_550;
  psStack_560 = (secp256k1_ge *)0x14c96e;
  memcpy(psVar21,psVar24,0x98);
  psStack_560 = (secp256k1_ge *)0x14c976;
  secp256k1_fe_normalize((secp256k1_fe *)r_02);
  r_04 = &sStack_488;
  psStack_560 = (secp256k1_ge *)0x14c986;
  secp256k1_fe_normalize(&r_04->x);
  psVar34 = &sStack_488.y;
  psStack_560 = (secp256k1_ge *)0x14c996;
  secp256k1_fe_normalize(psVar34);
  psStack_560 = (secp256k1_ge *)0x14c99e;
  secp256k1_fe_normalize((secp256k1_fe *)psVar21);
  psVar35 = (secp256k1_ge *)(auStack_550 + 0x30);
  psStack_560 = (secp256k1_ge *)0x14c9ab;
  secp256k1_fe_normalize((secp256k1_fe *)psVar35);
  r_03 = (secp256k1_ge *)auStack_4f0;
  psStack_560 = (secp256k1_ge *)0x14c9b8;
  secp256k1_fe_normalize((secp256k1_fe *)r_03);
  psStack_560 = (secp256k1_ge *)0x14c9c0;
  secp256k1_fe_verify((secp256k1_fe *)r_02);
  psStack_560 = (secp256k1_ge *)0x14c9c8;
  psVar25 = psVar21;
  secp256k1_fe_verify((secp256k1_fe *)psVar21);
  if (iStack_48c == 0) {
    psStack_560 = (secp256k1_ge *)0x14cacd;
    gej_xyz_equals_gej_cold_6();
LAB_0014cacd:
    psStack_560 = (secp256k1_ge *)0x14cad2;
    gej_xyz_equals_gej_cold_5();
LAB_0014cad2:
    psStack_560 = (secp256k1_ge *)0x14cad7;
    gej_xyz_equals_gej_cold_4();
LAB_0014cad7:
    psStack_560 = (secp256k1_ge *)0x14cadc;
    gej_xyz_equals_gej_cold_3();
LAB_0014cadc:
    psStack_560 = (secp256k1_ge *)0x14cae1;
    gej_xyz_equals_gej_cold_2();
  }
  else {
    if (auStack_550._44_4_ == 0) goto LAB_0014cacd;
    uVar12 = 4;
    do {
      uVar30 = *(ulong *)(auStack_550 + (ulong)uVar12 * 8);
      uVar17 = *(ulong *)(auStack_4f0 + (ulong)uVar12 * 8 + 0x38);
      if (uVar17 >= uVar30 && uVar17 != uVar30) {
        psVar21 = (secp256k1_ge *)0x1;
        goto LAB_0014ca0a;
      }
      if (uVar17 < uVar30) {
        psVar21 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca0a;
      }
      bVar41 = uVar12 != 0;
      uVar12 = uVar12 - 1;
    } while (bVar41);
    psVar21 = (secp256k1_ge *)0x0;
LAB_0014ca0a:
    psStack_560 = (secp256k1_ge *)0x14ca12;
    secp256k1_fe_verify(&r_04->x);
    psStack_560 = (secp256k1_ge *)0x14ca1a;
    psVar25 = psVar35;
    secp256k1_fe_verify((secp256k1_fe *)psVar35);
    if (sStack_488.x.normalized == 0) goto LAB_0014cad2;
    if (iStack_4f4 == 0) goto LAB_0014cad7;
    uVar12 = 4;
    do {
      uVar30 = *(ulong *)(auStack_550 + (ulong)uVar12 * 8 + 0x30);
      uVar17 = sStack_488.x.n[uVar12];
      if (uVar17 >= uVar30 && uVar17 != uVar30) {
        r_04 = (secp256k1_ge *)0x1;
        goto LAB_0014ca63;
      }
      if (uVar17 < uVar30) {
        r_04 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca63;
      }
      bVar41 = uVar12 != 0;
      uVar12 = uVar12 - 1;
    } while (bVar41);
    r_04 = (secp256k1_ge *)0x0;
LAB_0014ca63:
    psStack_560 = (secp256k1_ge *)0x14ca6b;
    secp256k1_fe_verify(psVar34);
    psStack_560 = (secp256k1_ge *)0x14ca73;
    psVar25 = r_03;
    secp256k1_fe_verify((secp256k1_fe *)r_03);
    if (sStack_488.y.normalized == 0) goto LAB_0014cadc;
    if (auStack_4f0._44_4_ != 0) {
      uVar12 = 4;
      do {
        if (sStack_488.y.n[uVar12] != *(uint64_t *)(auStack_4f0 + (ulong)uVar12 * 8)) {
          return;
        }
        bVar41 = uVar12 != 0;
        uVar12 = uVar12 - 1;
      } while (bVar41);
      return;
    }
  }
  psStack_560 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_700;
  psStack_8b8 = (secp256k1_ge *)0x14cb12;
  psStack_7c8 = psVar25;
  psStack_588 = psVar34;
  psStack_580 = psVar35;
  psStack_578 = r_02;
  psStack_570 = r_03;
  psStack_568 = r_04;
  psStack_560 = psVar21;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)psVar25);
  psStack_8b8 = (secp256k1_ge *)0x14cb1a;
  a_00 = r_01;
  iVar11 = secp256k1_ge_is_valid_var(r_01);
  if (iVar11 != 0) {
    psStack_8b8 = (secp256k1_ge *)0x14cb51;
    secp256k1_gej_set_ge(&sStack_620,&sStack_700);
    psStack_8b8 = (secp256k1_ge *)0x14cb5e;
    secp256k1_gej_double_var(&sStack_620,&sStack_620,(secp256k1_fe *)0x0);
    psStack_8b8 = (secp256k1_ge *)0x14cb6e;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_770,&sStack_620);
    r_01 = (secp256k1_ge *)0x40;
    uStack_8a4 = auStack_770._40_4_;
    while( true ) {
      uVar12 = uStack_8a4;
      psVar27 = (secp256k1_ge *)(ulong)uStack_8a4;
      a_01 = (secp256k1_ge *)0x3fffffffffffc;
      psVar21 = (secp256k1_ge *)0xffffffffffff;
      psStack_8b8 = (secp256k1_ge *)0x14cb8c;
      secp256k1_fe_verify(&sStack_700.x);
      psVar25 = (secp256k1_ge *)0x1;
      psStack_8b8 = (secp256k1_ge *)0x14cb99;
      secp256k1_fe_verify_magnitude(&sStack_700.x,1);
      auStack_8a0._48_8_ = 0x3ffffbfffff0bc - sStack_700.x.n[0];
      uStack_868 = 0x3ffffffffffffc - sStack_700.x.n[1];
      uStack_860 = 0x3ffffffffffffc - sStack_700.x.n[2];
      uStack_858 = 0x3ffffffffffffc - sStack_700.x.n[3];
      uStack_850 = 0x3fffffffffffc - sStack_700.x.n[4];
      uStack_848._0_4_ = 2;
      uStack_848._4_4_ = 0;
      r_02 = (secp256k1_ge *)(auStack_8a0 + 0x30);
      psStack_8b8 = (secp256k1_ge *)0x14cbed;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_8b8 = (secp256k1_ge *)0x14cbf5;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      a_00 = (secp256k1_ge *)auStack_770;
      psStack_8b8 = (secp256k1_ge *)0x14cc02;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      if (0x20 < (int)((int)uStack_848 + uVar12)) break;
      uStack_790 = auStack_770._0_8_;
      uStack_788 = auStack_770._8_8_;
      auStack_8a0._48_8_ = auStack_8a0._48_8_ + auStack_770._0_8_;
      uStack_868 = uStack_868 + auStack_770._8_8_;
      uStack_780 = auStack_770._16_8_;
      uStack_778 = auStack_770._24_8_;
      uStack_860 = uStack_860 + auStack_770._16_8_;
      uStack_858 = uStack_858 + auStack_770._24_8_;
      uStack_7b8 = auStack_770._32_8_;
      uStack_850 = uStack_850 + auStack_770._32_8_;
      uStack_848 = (ulong)((int)uStack_848 + uVar12);
      psStack_8b8 = (secp256k1_ge *)0x14cc87;
      auStack_840._56_8_ = r_01;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_8b8 = (secp256k1_ge *)0x14cc8f;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      auStack_8a0._48_8_ = (uStack_850 >> 0x30) * 0x1000003d1 + auStack_8a0._48_8_;
      uStack_868 = ((ulong)auStack_8a0._48_8_ >> 0x34) + uStack_868;
      uStack_860 = (uStack_868 >> 0x34) + uStack_860;
      uVar30 = (uStack_860 >> 0x34) + uStack_858;
      psVar35 = (secp256k1_ge *)0xfffffffffffff;
      uStack_858 = uVar30 & 0xfffffffffffff;
      uStack_850 = (uVar30 >> 0x34) + (uStack_850 & 0xffffffffffff);
      uStack_860 = uStack_860 & 0xfffffffffffff;
      uStack_868 = uStack_868 & 0xfffffffffffff;
      auStack_8a0._48_8_ = auStack_8a0._48_8_ & 0xfffffffffffff;
      uStack_848 = CONCAT44(uStack_848._4_4_,1);
      psStack_8b8 = (secp256k1_ge *)0x14cd1e;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_8b8 = (secp256k1_ge *)0x14cd2e;
      secp256k1_fe_verify(&sStack_700.y);
      psVar25 = (secp256k1_ge *)0x1;
      psStack_8b8 = (secp256k1_ge *)0x14cd3b;
      secp256k1_fe_verify_magnitude(&sStack_700.y,1);
      auStack_8a0._0_8_ = 0x3ffffbfffff0bc - sStack_700.y.n[0];
      auStack_8a0._8_8_ = 0x3ffffffffffffc - sStack_700.y.n[1];
      auStack_8a0._16_8_ = 0x3ffffffffffffc - sStack_700.y.n[2];
      auStack_8a0._24_8_ = 0x3ffffffffffffc - sStack_700.y.n[3];
      auStack_8a0._32_8_ = 0x3fffffffffffc - sStack_700.y.n[4];
      auStack_8a0._40_4_ = 2;
      auStack_8a0._44_4_ = 0;
      psVar27 = (secp256k1_ge *)auStack_8a0;
      psStack_8b8 = (secp256k1_ge *)0x14cd8f;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      psStack_8b8 = (secp256k1_ge *)0x14cd97;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      a_00 = (secp256k1_ge *)(auStack_770 + 0x30);
      psStack_8b8 = (secp256k1_ge *)0x14cda4;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar12 = uStack_718;
      r_01 = (secp256k1_ge *)(ulong)uStack_718;
      if (0x20 < (int)(auStack_8a0._40_4_ + uStack_718)) goto LAB_0014d4a1;
      uStack_7b0 = auStack_770._48_8_;
      uStack_7a8 = uStack_738;
      auStack_8a0._0_8_ = auStack_8a0._0_8_ + auStack_770._48_8_;
      auStack_8a0._8_8_ = auStack_8a0._8_8_ + uStack_738;
      uStack_7a0 = uStack_730;
      uStack_798 = uStack_728;
      auStack_8a0._16_8_ = auStack_8a0._16_8_ + uStack_730;
      auStack_8a0._24_8_ = auStack_8a0._24_8_ + uStack_728;
      psStack_7c0 = psStack_720;
      auStack_8a0._32_8_ = (long)(psStack_720->x).n + auStack_8a0._32_8_;
      auStack_8a0._44_4_ = 0;
      auStack_8a0._40_4_ = auStack_8a0._40_4_ + uStack_718;
      psStack_8b8 = (secp256k1_ge *)0x14ce27;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      psStack_8b8 = (secp256k1_ge *)0x14ce2f;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      a_01 = (secp256k1_ge *)0x1000003d1;
      auStack_8a0._0_8_ = ((ulong)auStack_8a0._32_8_ >> 0x30) * 0x1000003d1 + auStack_8a0._0_8_;
      auStack_8a0._8_8_ = ((ulong)auStack_8a0._0_8_ >> 0x34) + auStack_8a0._8_8_;
      auStack_8a0._16_8_ = ((ulong)auStack_8a0._8_8_ >> 0x34) + auStack_8a0._16_8_;
      uVar30 = ((ulong)auStack_8a0._16_8_ >> 0x34) + auStack_8a0._24_8_;
      auStack_8a0._24_8_ = uVar30 & 0xfffffffffffff;
      auStack_8a0._32_8_ = (uVar30 >> 0x34) + (auStack_8a0._32_8_ & 0xffffffffffff);
      auStack_8a0._16_8_ = auStack_8a0._16_8_ & 0xfffffffffffff;
      auStack_8a0._8_8_ = auStack_8a0._8_8_ & 0xfffffffffffff;
      auStack_8a0._0_8_ = auStack_8a0._0_8_ & 0xfffffffffffff;
      auStack_8a0._40_4_ = 1;
      psStack_8b8 = (secp256k1_ge *)0x14ceb4;
      secp256k1_fe_verify((secp256k1_fe *)psVar27);
      psStack_8b8 = (secp256k1_ge *)0x14cebc;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      uVar30 = (uStack_850 >> 0x30) * 0x1000003d1 + auStack_8a0._48_8_;
      r_02 = (secp256k1_ge *)0xffffefffffc2f;
      if (((uVar30 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar30 & 0xfffffffffffff) == 0)) {
        uVar17 = (uVar30 >> 0x34) + uStack_868;
        uVar26 = (uVar17 >> 0x34) + uStack_860;
        uVar31 = (uVar26 >> 0x34) + uStack_858;
        uVar32 = (uVar31 >> 0x34) + (uStack_850 & 0xffffffffffff);
        if ((((uVar17 | uVar30 | uVar26 | uVar31) & 0xfffffffffffff) != 0 || uVar32 != 0) &&
           ((uVar30 + 0x1000003d0 & uVar17 & uVar26 & uVar31 & (uVar32 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d046;
        psStack_8b8 = (secp256k1_ge *)0x14cf84;
        secp256k1_fe_verify((secp256k1_fe *)auStack_8a0);
        uVar30 = ((ulong)auStack_8a0._32_8_ >> 0x30) * 0x1000003d1 + auStack_8a0._0_8_;
        if (((uVar30 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar30 & 0xfffffffffffff) != 0))
        goto LAB_0014d046;
        uVar17 = (uVar30 >> 0x34) + auStack_8a0._8_8_;
        psVar25 = (secp256k1_ge *)((uVar17 >> 0x34) + auStack_8a0._16_8_);
        a_00 = (secp256k1_ge *)(((ulong)psVar25 >> 0x34) + auStack_8a0._24_8_);
        uVar26 = ((ulong)a_00 >> 0x34) + (auStack_8a0._32_8_ & 0xffffffffffff);
        r_03 = psVar27;
        r_04 = a_01;
        if ((((uVar17 | uVar30 | (ulong)psVar25 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar26 != 0) &&
           ((uVar30 + 0x1000003d0 & uVar17 & (ulong)psVar25 & (ulong)a_00 &
            (uVar26 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d046;
        goto LAB_0014d4bf;
      }
LAB_0014d046:
      psVar25 = (secp256k1_ge *)
                ((long)(psStack_7c8->x).n + (long)((secp256k1_fe *)auStack_840._56_8_)->n);
      psVar35 = &sStack_690;
      psStack_8b8 = (secp256k1_ge *)0x14d06a;
      secp256k1_ge_from_storage(psVar35,(secp256k1_ge_storage *)psVar25);
      psStack_8b8 = (secp256k1_ge *)0x14d072;
      a_00 = psVar35;
      iVar11 = secp256k1_ge_is_valid_var(psVar35);
      if (iVar11 == 0) goto LAB_0014d4a6;
      psStack_8b8 = (secp256k1_ge *)0x14d082;
      secp256k1_fe_verify(&psVar35->x);
      psVar25 = (secp256k1_ge *)0x1;
      psStack_8b8 = (secp256k1_ge *)0x14d08f;
      secp256k1_fe_verify_magnitude(&psVar35->x,1);
      auStack_840._0_8_ = 0x3ffffbfffff0bc - sStack_690.x.n[0];
      auStack_840._8_8_ = 0x3ffffffffffffc - sStack_690.x.n[1];
      auStack_840._16_8_ = 0x3ffffffffffffc - sStack_690.x.n[2];
      auStack_840._24_8_ = 0x3ffffffffffffc - sStack_690.x.n[3];
      auStack_840._32_8_ = 0x3fffffffffffc - sStack_690.x.n[4];
      auStack_840._40_8_ = 2;
      psVar21 = (secp256k1_ge *)auStack_840;
      psStack_8b8 = (secp256k1_ge *)0x14d0f3;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      psStack_8b8 = (secp256k1_ge *)0x14d0fb;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      a_00 = (secp256k1_ge *)auStack_770;
      psStack_8b8 = (secp256k1_ge *)0x14d108;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      r_03 = psStack_7c0;
      if (0x20 < (int)(auStack_840._40_4_ + uStack_8a4)) goto LAB_0014d4ab;
      psVar35 = (secp256k1_ge *)0xffffefffffc2f;
      r_02 = (secp256k1_ge *)0x1000003d1;
      auStack_840._0_8_ = uStack_790 + auStack_840._0_8_;
      auStack_840._8_8_ = uStack_788 + auStack_840._8_8_;
      auStack_840._16_8_ = uStack_780 + auStack_840._16_8_;
      auStack_840._24_8_ = uStack_778 + auStack_840._24_8_;
      auStack_840._32_8_ = auStack_840._32_8_ + uStack_7b8;
      auStack_840._44_4_ = 0;
      auStack_840._40_4_ = auStack_840._40_4_ + uStack_8a4;
      psStack_8b8 = (secp256k1_ge *)0x14d186;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      uStack_7e0 = sStack_690.y.n[4];
      uStack_7d8._0_4_ = sStack_690.y.magnitude;
      uStack_7d8._4_4_ = sStack_690.y.normalized;
      uStack_7f0 = sStack_690.y.n[2];
      uStack_7e8 = sStack_690.y.n[3];
      auStack_840._64_8_ = sStack_690.y.n[0];
      uStack_7f8 = sStack_690.y.n[1];
      r_04 = (secp256k1_ge *)(auStack_840 + 0x40);
      psStack_8b8 = (secp256k1_ge *)0x14d1c1;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      a_00 = (secp256k1_ge *)(auStack_770 + 0x30);
      psStack_8b8 = (secp256k1_ge *)0x14d1ce;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar12 = uVar12 + (int)uStack_7d8;
      r_01 = (secp256k1_ge *)(ulong)uVar12;
      psVar27 = r_03;
      a_01 = r_04;
      if (0x20 < (int)uVar12) goto LAB_0014d4b0;
      auStack_840._64_8_ = uStack_7b0 + auStack_840._64_8_;
      uStack_7f8 = uStack_7a8 + uStack_7f8;
      uStack_7f0 = uStack_7a0 + uStack_7f0;
      uStack_7e8 = uStack_798 + uStack_7e8;
      uStack_7e0 = (long)(r_03->x).n + uStack_7e0;
      uStack_7d8 = (ulong)uVar12;
      psStack_8b8 = (secp256k1_ge *)0x14d236;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      psStack_8b8 = (secp256k1_ge *)0x14d23e;
      secp256k1_fe_verify((secp256k1_fe *)psVar21);
      uVar30 = ((ulong)auStack_840._32_8_ >> 0x30) * 0x1000003d1 + auStack_840._0_8_;
      if (((uVar30 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar30 & 0xfffffffffffff) == 0)) {
        uVar17 = (uVar30 >> 0x34) + auStack_840._8_8_;
        uVar26 = (uVar17 >> 0x34) + auStack_840._16_8_;
        uVar31 = (uVar26 >> 0x34) + auStack_840._24_8_;
        uVar32 = (uVar31 >> 0x34) + (auStack_840._32_8_ & 0xffffffffffff);
        if ((((uVar17 | uVar30 | uVar26 | uVar31) & 0xfffffffffffff) != 0 || uVar32 != 0) &&
           ((uVar30 + 0x1000003d0 & uVar17 & uVar26 & uVar31 & (uVar32 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d3de;
        psStack_8b8 = (secp256k1_ge *)0x14d30d;
        secp256k1_fe_verify((secp256k1_fe *)r_04);
        uVar30 = (uStack_7e0 >> 0x30) * 0x1000003d1 + auStack_840._64_8_;
        if (((uVar30 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar30 & 0xfffffffffffff) != 0))
        goto LAB_0014d3de;
        uVar17 = (uVar30 >> 0x34) + uStack_7f8;
        psVar25 = (secp256k1_ge *)((uVar17 >> 0x34) + uStack_7f0);
        a_00 = (secp256k1_ge *)(((ulong)psVar25 >> 0x34) + uStack_7e8);
        uVar26 = ((ulong)a_00 >> 0x34) + (uStack_7e0 & 0xffffffffffff);
        if ((((uVar17 | uVar30 | (ulong)psVar25 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar26 != 0) &&
           ((uVar30 + 0x1000003d0 & uVar17 & (ulong)psVar25 & (ulong)a_00 &
            (uVar26 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d3de;
        goto LAB_0014d4c4;
      }
LAB_0014d3de:
      a_01 = (secp256k1_ge *)(auStack_8a0 + 0x30);
      psVar21 = (secp256k1_ge *)auStack_840;
      psStack_8b8 = (secp256k1_ge *)0x14d3f6;
      iVar11 = secp256k1_fe_equal((secp256k1_fe *)a_01,(secp256k1_fe *)psVar21);
      r_02 = (secp256k1_ge *)auStack_8a0;
      if (iVar11 != 0) {
        psStack_8b8 = (secp256k1_ge *)0x14d40a;
        psVar25 = r_04;
        a_00 = r_02;
        iVar11 = secp256k1_fe_equal((secp256k1_fe *)r_02,(secp256k1_fe *)r_04);
        if (iVar11 == 0) goto LAB_0014d412;
        goto LAB_0014d4ba;
      }
LAB_0014d412:
      psStack_8b8 = (secp256k1_ge *)0x14d420;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,(secp256k1_fe *)r_04);
      psStack_8b8 = (secp256k1_ge *)0x14d42e;
      secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,(secp256k1_fe *)psVar21);
      psStack_8b8 = (secp256k1_ge *)0x14d439;
      psVar25 = r_02;
      a_00 = a_01;
      iVar11 = secp256k1_fe_equal((secp256k1_fe *)a_01,(secp256k1_fe *)r_02);
      if (iVar11 == 0) goto LAB_0014d4b5;
      psVar25 = &sStack_690;
      psVar21 = &sStack_700;
      for (lVar37 = 0xd; lVar37 != 0; lVar37 = lVar37 + -1) {
        (psVar21->x).n[0] = (psVar25->x).n[0];
        psVar25 = (secp256k1_ge *)((long)psVar25 + ((ulong)bVar10 * -2 + 1) * 8);
        psVar21 = (secp256k1_ge *)((long)psVar21 + ((ulong)bVar10 * -2 + 1) * 8);
      }
      r_01 = (secp256k1_ge *)(((secp256k1_fe *)(auStack_840._56_8_ + 0x30))->n + 2);
      if (r_01 == (secp256k1_ge *)0x80000) {
        return;
      }
    }
    psStack_8b8 = (secp256k1_ge *)0x14d4a1;
    test_pre_g_table_cold_9();
LAB_0014d4a1:
    psStack_8b8 = (secp256k1_ge *)0x14d4a6;
    test_pre_g_table_cold_8();
LAB_0014d4a6:
    psStack_8b8 = (secp256k1_ge *)0x14d4ab;
    test_pre_g_table_cold_7();
LAB_0014d4ab:
    psStack_8b8 = (secp256k1_ge *)0x14d4b0;
    test_pre_g_table_cold_6();
LAB_0014d4b0:
    r_04 = psVar27;
    psStack_8b8 = (secp256k1_ge *)0x14d4b5;
    test_pre_g_table_cold_5();
LAB_0014d4b5:
    psStack_8b8 = (secp256k1_ge *)0x14d4ba;
    test_pre_g_table_cold_4();
LAB_0014d4ba:
    psStack_8b8 = (secp256k1_ge *)0x14d4bf;
    test_pre_g_table_cold_3();
    r_03 = r_04;
    r_04 = a_01;
LAB_0014d4bf:
    psStack_8b8 = (secp256k1_ge *)0x14d4c4;
    test_pre_g_table_cold_1();
LAB_0014d4c4:
    psStack_8b8 = (secp256k1_ge *)0x14d4c9;
    test_pre_g_table_cold_2();
  }
  psStack_8b8 = (secp256k1_ge *)secp256k1_wnaf_fixed;
  test_pre_g_table_cold_10();
  pcStack_910 = (code *)0x14d4ed;
  psVar27 = psVar25;
  psStack_8e0 = r_01;
  psStack_8d8 = psVar35;
  psStack_8d0 = r_02;
  psStack_8c8 = r_03;
  psStack_8c0 = r_04;
  psStack_8b8 = psVar21;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar25);
  auVar42._0_4_ = -(uint)((int)(psVar25->x).n[2] == 0 && (int)(psVar25->x).n[0] == 0);
  auVar42._4_4_ =
       -(uint)(*(int *)((long)(psVar25->x).n + 0x14) == 0 && *(int *)((long)(psVar25->x).n + 4) == 0
              );
  auVar42._8_4_ = -(uint)((int)(psVar25->x).n[3] == 0 && (int)(psVar25->x).n[1] == 0);
  auVar42._12_4_ =
       -(uint)(*(int *)((long)(psVar25->x).n + 0x1c) == 0 &&
              *(int *)((long)(psVar25->x).n + 0xc) == 0);
  iVar11 = movmskps(extraout_EAX,auVar42);
  if (iVar11 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      pcStack_910 = (code *)0x14d5e7;
      memset(a_00,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
    return;
  }
  pcStack_910 = (code *)0x14d51a;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar25);
  uVar12 = (uint)(psVar25->x).n[0];
  pcStack_910 = (code *)0x14d526;
  psVar21 = psVar25;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar25);
  if (0xffffffdf < extraout_EDX - 0x21) {
    uVar12 = ~uVar12 & 1;
    pcStack_910 = (code *)0x14d544;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar25);
    bVar16 = (byte)extraout_EDX;
    *(uint *)(a_00->x).n =
         ((uint)((int)(psVar25->x).n[extraout_EDX - 1 >> 6] << (-bVar16 & 0x1f)) >> (-bVar16 & 0x1f)
         ) + uVar12;
    bVar10 = 0x7f / bVar16;
    uStack_8e8 = (ulong)bVar10;
    uVar19 = (uint)bVar10;
    uVar36 = 0x80 - bVar10 * extraout_EDX;
    uVar30 = uStack_8e8;
    uStack_8fc = uVar12;
    psStack_8f0 = psVar25;
    do {
      uVar12 = extraout_EDX;
      if (uVar30 == uStack_8e8) {
        uVar12 = uVar36;
      }
      pcStack_910 = (code *)0x14d59f;
      uVar13 = secp256k1_scalar_get_bits_var
                         ((secp256k1_scalar *)psStack_8f0,(uint)uVar30 * extraout_EDX,uVar12);
      uVar12 = (uint)uVar30;
      if (uVar13 != 0) break;
      *(undefined4 *)((long)(a_00->x).n + uVar30 * 4) = 0;
      uVar19 = uVar19 - 1;
      bVar41 = 1 < (long)uVar30;
      uVar30 = uVar30 - 1;
      uVar12 = uVar19;
    } while (bVar41);
    if ((int)uVar12 < 1) {
      return;
    }
    iStack_8f8 = -1 << (bVar16 & 0x1f);
    iStack_8f4 = 1 << (bVar16 & 0x1f);
    uVar30 = 1;
    uVar19 = extraout_EDX;
    do {
      count = extraout_EDX;
      if (uStack_8e8 == uVar30) {
        count = uVar36;
      }
      pcStack_910 = (code *)0x14d63c;
      uVar13 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psStack_8f0,uVar19,count);
      if ((uVar13 & 1) == 0) {
        piVar4 = (int *)((long)(a_00->x).n + uVar30 * 4 + -4);
        *piVar4 = *piVar4 + iStack_8f8;
        uVar13 = uVar13 | 1;
      }
      *(uint32_t *)((long)(a_00->x).n + uVar30 * 4) = uVar13;
      if (1 < uVar30) {
        iVar11 = *(int *)((long)(a_00->x).n + uVar30 * 4 + -4);
        if (iVar11 == -1) {
          iVar11 = *(int *)((long)(a_00->x).n + uVar30 * 4 + -8);
          if (0 < iVar11) {
            iVar11 = iVar11 + iStack_8f8;
            goto LAB_0014d681;
          }
        }
        else if ((iVar11 == 1) &&
                (iVar11 = *(int *)((long)(a_00->x).n + uVar30 * 4 + -8), iVar11 < 0)) {
          iVar11 = iVar11 + iStack_8f4;
LAB_0014d681:
          *(int *)((long)(a_00->x).n + uVar30 * 4 + -8) = iVar11;
          *(undefined4 *)((long)(a_00->x).n + uVar30 * 4 + -4) = 0;
        }
      }
      uVar30 = uVar30 + 1;
      uVar19 = uVar19 + extraout_EDX;
      if (uVar12 + 1 == uVar30) {
        return;
      }
    } while( true );
  }
  pcStack_910 = test_fixed_wnaf_small_helper;
  secp256k1_wnaf_fixed_cold_1();
  uVar30 = 0x20;
  do {
    uVar19 = (int)uVar30 - 1;
    uVar30 = (ulong)uVar19;
    if (*(int *)((long)(psVar21->x).n + uVar30 * 4) != 0) {
      pcStack_918 = (code *)0x14d6e2;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014d6e2;
    }
  } while (8 < uVar19);
  uVar19 = 7;
  while (*(int *)((long)(psVar21->x).n + (ulong)uVar19 * 4) ==
         *(int *)((long)(psVar27->x).n + (ulong)uVar19 * 4)) {
    bVar41 = uVar19 == 0;
    uVar19 = uVar19 - 1;
    if (bVar41) {
      return;
    }
  }
LAB_0014d6e2:
  pcStack_918 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar14 = (secp256k1_gej *)auStack_1538;
  psVar22 = (secp256k1_strauss_point_state *)((ulong)psVar27 & 0xffffffff);
  psVar39 = (secp256k1_scalar *)auStack_1518;
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d70a;
  psStack_940 = a_00;
  psStack_938 = psVar25;
  psStack_930 = r_02;
  uStack_928 = (ulong)extraout_EDX;
  psStack_920 = r_04;
  pcStack_918 = (code *)(ulong)uVar12;
  testutil_random_scalar_order_test(psVar39);
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d71b;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_1538,psVar39,(secp256k1_scalar *)psVar21);
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d726;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_1538,(secp256k1_scalar *)auStack_1538);
  if ((int)psVar27 == 0) {
    psStack_1540 = (secp256k1_strauss_point_state *)0x14d81f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_13b0,(secp256k1_scalar *)auStack_1518);
    psStack_1540 = (secp256k1_strauss_point_state *)0x14d836;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1448,(secp256k1_scalar *)auStack_1538);
    psStack_1540 = (secp256k1_strauss_point_state *)0x14d84a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_14e0,(secp256k1_scalar *)psVar21);
  }
  else {
    psStack_1540 = (secp256k1_strauss_point_state *)0x14d73e;
    testutil_random_ge_test(&sStack_1318);
    psStack_1540 = (secp256k1_strauss_point_state *)0x14d74e;
    secp256k1_gej_set_ge(&sStack_12b0,&sStack_1318);
    if ((int)psVar27 == 1) {
      psVar25 = asStack_1218;
      r_02 = asStack_1098;
      psVar22 = &sStack_d58;
      psVar39 = &secp256k1_scalar_zero;
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d7ae;
      sStack_1448.x.n[0] = (uint64_t)psVar25;
      sStack_1448.x.n[1] = (uint64_t)r_02;
      sStack_1448.x.n[2] = (uint64_t)psVar22;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1448,&sStack_13b0,1,&sStack_12b0,
                 (secp256k1_scalar *)auStack_1518,&secp256k1_scalar_zero);
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d7d9;
      sStack_14e0.x.n[0] = (uint64_t)psVar25;
      sStack_14e0.x.n[1] = (uint64_t)r_02;
      sStack_14e0.x.n[2] = (uint64_t)psVar22;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_14e0,&sStack_1448,1,&sStack_12b0,
                 (secp256k1_scalar *)auStack_1538,&secp256k1_scalar_zero);
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d801;
      auStack_1518._32_8_ = psVar25;
      psStack_14f0 = r_02;
      psStack_14e8 = psVar22;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_1518 + 0x20),&sStack_14e0,1,&sStack_12b0,
                 (secp256k1_scalar *)psVar21,&secp256k1_scalar_zero);
      psVar14 = &sStack_12b0;
    }
    else {
      psVar39 = (secp256k1_scalar *)&sStack_1318;
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d869;
      secp256k1_ecmult_const(&sStack_13b0,(secp256k1_ge *)psVar39,(secp256k1_scalar *)auStack_1518);
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d87c;
      secp256k1_ecmult_const(&sStack_1448,(secp256k1_ge *)psVar39,(secp256k1_scalar *)auStack_1538);
      psStack_1540 = (secp256k1_strauss_point_state *)0x14d88c;
      secp256k1_ecmult_const(&sStack_14e0,(secp256k1_ge *)psVar39,(secp256k1_scalar *)psVar21);
      psVar14 = (secp256k1_gej *)auStack_1538;
    }
  }
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d8a6;
  secp256k1_gej_add_var(&sStack_14e0,&sStack_14e0,&sStack_13b0,(secp256k1_fe *)0x0);
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d8bb;
  psVar24 = &sStack_14e0;
  secp256k1_gej_add_var(&sStack_14e0,&sStack_14e0,&sStack_1448,(secp256k1_fe *)0x0);
  psStack_1540 = (secp256k1_strauss_point_state *)0x14d8c3;
  psVar28 = &sStack_14e0;
  secp256k1_gej_verify(&sStack_14e0);
  if (sStack_14e0.infinity != 0) {
    return;
  }
  psStack_1540 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar28 & 0xffffffff);
  pcStack_16a8 = (code *)0x14d911;
  psStack_1690 = psVar24;
  lStack_1688 = extraout_RDX_00;
  psStack_1568 = &sStack_14e0;
  psStack_1560 = psVar25;
  psStack_1558 = r_02;
  psStack_1550 = (secp256k1_ge *)psVar39;
  psStack_1548 = psVar14;
  psStack_1540 = psVar22;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_1696 = SUB84(psVar28,0);
  psVar40 = &sStack_15d0;
  sStack_15d0.s[0] = 0x6a09e667;
  sStack_15d0.s[1] = 0xbb67ae85;
  sStack_15d0.s[2] = 0x3c6ef372;
  sStack_15d0.s[3] = 0xa54ff53a;
  sStack_15d0.s[4] = 0x510e527f;
  sStack_15d0.s[5] = 0x9b05688c;
  sStack_15d0.s[6] = 0x1f83d9ab;
  sStack_15d0.s[7] = 0x5be0cd19;
  psVar24 = (secp256k1_gej *)0x0;
  sStack_15d0.bytes = 0;
  psVar39 = (secp256k1_scalar *)(auStack_1680 + 0x20);
  auStack_1680._32_8_ = 0;
  uStack_1658._0_4_ = 0;
  uStack_1658._4_4_ = 0;
  uStack_1650 = 0;
  uStack_1648 = 0;
  pcStack_16a8 = (code *)0x14d95b;
  secp256k1_scalar_verify(psVar39);
  pcStack_16a8 = (code *)0x14d969;
  test_ecmult_accumulate(psVar40,psVar39,scratch);
  auStack_1680._32_8_ = 1;
  uStack_1658._0_4_ = 0;
  uStack_1658._4_4_ = 0;
  uStack_1650 = 0;
  uStack_1648 = 0;
  pcStack_16a8 = (code *)0x14d985;
  secp256k1_scalar_verify(psVar39);
  pcStack_16a8 = (code *)0x14d993;
  test_ecmult_accumulate(psVar40,psVar39,scratch);
  pcStack_16a8 = (code *)0x14d99e;
  secp256k1_scalar_negate(psVar39,psVar39);
  pcStack_16a8 = (code *)0x14d9af;
  test_ecmult_accumulate(psVar40,psVar39,scratch);
  psVar14 = psStack_1690;
  if (psStack_1690 != (secp256k1_gej *)0x0) {
    psVar24 = (secp256k1_gej *)0x0;
    psVar40 = &sStack_1640;
    out32 = auStack_1680;
    do {
      uStack_1692 = SUB82(psVar24,0);
      sStack_1640.s[0] = 0x6a09e667;
      sStack_1640.s[1] = 0xbb67ae85;
      sStack_1640.s[2] = 0x3c6ef372;
      sStack_1640.s[3] = 0xa54ff53a;
      sStack_1640.s[4] = 0x510e527f;
      sStack_1640.s[5] = 0x9b05688c;
      sStack_1640.s[6] = 0x1f83d9ab;
      sStack_1640.s[7] = 0x5be0cd19;
      sStack_1640.bytes = 0;
      pcStack_16a8 = (code *)0x14da0b;
      secp256k1_sha256_write(psVar40,(uchar *)&uStack_1696,6);
      pcStack_16a8 = (code *)0x14da16;
      secp256k1_sha256_finalize(psVar40,out32);
      pcStack_16a8 = (code *)0x14da23;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_1680 + 0x20),out32,(int *)0x0);
      pcStack_16a8 = (code *)0x14da36;
      test_ecmult_accumulate(&sStack_15d0,(secp256k1_scalar *)(auStack_1680 + 0x20),scratch);
      psVar24 = (secp256k1_gej *)((long)(psVar24->x).n + 1);
    } while (psVar14 != psVar24);
  }
  hash = &sStack_15d0;
  psVar25 = (secp256k1_ge *)auStack_1680;
  pcStack_16a8 = (code *)0x14da50;
  secp256k1_sha256_finalize(hash,(uchar *)psVar25);
  lVar37 = 0;
  while (auStack_1680[lVar37] == *(char *)(lStack_1688 + lVar37)) {
    lVar37 = lVar37 + 1;
    if (lVar37 == 0x20) {
      pcStack_16a8 = (code *)0x14da78;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_16a8 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_16b0 = psVar14;
  auStack_2358 = (undefined1  [8])0x41;
  psStack_2370 = (secp256k1_scalar *)0x14dac8;
  psStack_16d0 = scratch;
  psStack_16c8 = psVar40;
  puStack_16c0 = auStack_1680 + 0x20;
  psStack_16b8 = psVar24;
  pcStack_16a8 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_2170,&secp256k1_ge_const_g);
  psStack_2370 = (secp256k1_scalar *)0x14dad5;
  secp256k1_gej_set_infinity(&sStack_2208);
  psStack_2370 = (secp256k1_scalar *)0x14daec;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_20d8 + 1,(secp256k1_scalar *)psVar25);
  psVar22 = (secp256k1_strauss_point_state *)(asStack_1e28[5].y.n + 3);
  psStack_2370 = (secp256k1_scalar *)0x14db3e;
  sStack_22a0.x.n[0] = (uint64_t)asStack_1fa8;
  sStack_22a0.x.n[1] = (uint64_t)asStack_1e28;
  sStack_22a0.x.n[2] = (uint64_t)psVar22;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_22a0,&sStack_20d8,1,&sStack_2170,
             (secp256k1_scalar *)psVar25,&secp256k1_scalar_zero);
  psStack_2370 = (secp256k1_scalar *)0x14db6e;
  auStack_2350._0_8_ = asStack_1fa8;
  auStack_2350._8_8_ = asStack_1e28;
  auStack_2350._16_8_ = psVar22;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_2350,&sStack_22a0,1,&sStack_2208,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar25);
  error_callback = (secp256k1_callback *)0xd0;
  psVar14 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  psVar35 = (secp256k1_ge *)0x0;
  psStack_2370 = (secp256k1_scalar *)0x14db9f;
  psVar39 = (secp256k1_scalar *)psVar25;
  psVar21 = scratch_00;
  iVar11 = secp256k1_ecmult_multi_var
                     ((secp256k1_callback *)psVar14,(secp256k1_scratch *)scratch_00,
                      (secp256k1_gej *)(asStack_1e28[5].y.n + 3),(secp256k1_scalar *)psVar25,
                      (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar11 == 0) {
    psStack_2370 = (secp256k1_scalar *)0x14dd04;
    test_ecmult_accumulate_cold_8();
LAB_0014dd04:
    psStack_2370 = (secp256k1_scalar *)0x14dd09;
    test_ecmult_accumulate_cold_7();
LAB_0014dd09:
    psStack_2370 = (secp256k1_scalar *)0x14dd0e;
    test_ecmult_accumulate_cold_6();
LAB_0014dd0e:
    psStack_2370 = (secp256k1_scalar *)0x14dd13;
    test_ecmult_accumulate_cold_5();
LAB_0014dd13:
    psStack_2370 = (secp256k1_scalar *)0x14dd18;
    test_ecmult_accumulate_cold_4();
LAB_0014dd18:
    psStack_2370 = (secp256k1_scalar *)0x14dd1d;
    test_ecmult_accumulate_cold_3();
LAB_0014dd1d:
    psStack_2370 = (secp256k1_scalar *)0x14dd22;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar39 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_2370 = (secp256k1_scalar *)0x14dbda;
    psVar21 = scratch_00;
    psVar14 = (secp256k1_gej *)error_callback;
    psVar35 = psVar25;
    iVar11 = secp256k1_ecmult_multi_var
                       (error_callback,(secp256k1_scratch *)scratch_00,asStack_1e28,
                        &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar25,1);
    if (iVar11 == 0) goto LAB_0014dd04;
    psStack_2370 = (secp256k1_scalar *)0x14dbf9;
    secp256k1_ecmult_const(asStack_1fa8,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar25);
    psVar25 = (secp256k1_ge *)auStack_2350;
    psStack_2370 = (secp256k1_scalar *)0x14dc0e;
    secp256k1_ge_set_gej_var(psVar25,&sStack_20d8 + 1);
    psVar14 = &sStack_20d8;
    psStack_2370 = (secp256k1_scalar *)0x14dc1e;
    psVar21 = psVar25;
    iVar11 = secp256k1_gej_eq_ge_var(psVar14,psVar25);
    if (iVar11 == 0) goto LAB_0014dd09;
    psVar14 = &sStack_22a0;
    psVar21 = (secp256k1_ge *)auStack_2350;
    psStack_2370 = (secp256k1_scalar *)0x14dc38;
    iVar11 = secp256k1_gej_eq_ge_var(psVar14,psVar21);
    if (iVar11 == 0) goto LAB_0014dd0e;
    psVar14 = (secp256k1_gej *)(asStack_1e28[5].y.n + 3);
    psVar21 = (secp256k1_ge *)auStack_2350;
    psStack_2370 = (secp256k1_scalar *)0x14dc52;
    iVar11 = secp256k1_gej_eq_ge_var(psVar14,psVar21);
    if (iVar11 == 0) goto LAB_0014dd13;
    psVar14 = asStack_1e28;
    psVar21 = (secp256k1_ge *)auStack_2350;
    psStack_2370 = (secp256k1_scalar *)0x14dc6c;
    iVar11 = secp256k1_gej_eq_ge_var(psVar14,psVar21);
    if (iVar11 == 0) goto LAB_0014dd18;
    psVar14 = asStack_1fa8;
    psVar21 = (secp256k1_ge *)auStack_2350;
    psStack_2370 = (secp256k1_scalar *)0x14dc86;
    iVar11 = secp256k1_gej_eq_ge_var(psVar14,psVar21);
    if (iVar11 == 0) goto LAB_0014dd1d;
    psStack_2370 = (secp256k1_scalar *)0x14dc9b;
    secp256k1_ge_verify((secp256k1_ge *)auStack_2350);
    if (auStack_2350._96_4_ != 0) {
      auStack_2350[0x68] = 0;
      sVar18 = 1;
LAB_0014dce3:
      psStack_2370 = (secp256k1_scalar *)0x14dced;
      secp256k1_sha256_write(hash,auStack_2350 + 0x68,sVar18);
      return;
    }
    psVar14 = (secp256k1_gej *)auStack_2350;
    psVar21 = (secp256k1_ge *)(auStack_2350 + 0x68);
    psVar25 = (secp256k1_ge *)auStack_2358;
    psVar39 = (secp256k1_scalar *)0x0;
    psStack_2370 = (secp256k1_scalar *)0x14dcd0;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar14,(uchar *)psVar21,(size_t *)psVar25,0);
    if (auStack_2358 == (undefined1  [8])0x41) {
      sVar18 = 0x41;
      goto LAB_0014dce3;
    }
  }
  psStack_2370 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_2370 = &secp256k1_scalar_zero;
  psStack_2398 = asStack_1fa8;
  psStack_2390 = error_callback;
  psStack_2380 = psVar25;
  psStack_2378 = psVar22;
  secp256k1_gej_set_infinity(r_00);
  if ((secp256k1_ge *)psVar39 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2c88.aux = asStack_2860;
      sStack_2c88.pre_a = asStack_26e0;
      sStack_2c88.ps = &sStack_2c70;
      secp256k1_ecmult_strauss_wnaf(&sStack_2c88,r_00,1,r_00,&secp256k1_scalar_zero,psVar39);
    }
    else {
      if ((psVar21 == (secp256k1_ge *)0x0) ||
         (sVar18 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar14,(secp256k1_scratch *)psVar21),
         sVar18 == 0)) {
LAB_0014df51:
        secp256k1_ecmult_multi_simple_var(r_00,psVar39,cb,psVar35,(size_t)hash);
        return;
      }
      uVar30 = 5000000;
      if (sVar18 < 5000000) {
        uVar30 = sVar18;
      }
      puVar2 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_2c90 = (ulong)puVar2 / uVar30 + 1;
      uVar30 = (ulong)puVar2 / uStack_2c90;
      if (uVar30 < 0x57) {
        lVar37 = 0;
        do {
          if (*(char *)((long)(psVar21->x).n + lVar37) != "scratch"[lVar37]) {
            (*(code *)(psVar14->x).n[0])("invalid scratch space",(psVar14->x).n[1]);
            goto LAB_0014df51;
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 != 8);
        uVar17 = (psVar21->x).n[3] - (psVar21->x).n[2];
        uVar30 = 0;
        if (0x4a < uVar17) {
          uVar30 = uVar17 - 0x4b;
        }
        if (uVar30 < 0x988) goto LAB_0014df51;
        uVar30 = uVar30 / 0x988;
        if (4999999 < uVar30) {
          uVar30 = 5000000;
        }
        uStack_2c90 = (ulong)puVar2 / uVar30 + 1;
        uVar30 = (ulong)puVar2 / uStack_2c90;
        pcVar15 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar15 = secp256k1_ecmult_pippenger_batch;
      }
      psVar40 = (secp256k1_sha256 *)(uVar30 + 1);
      lVar37 = 0;
      uVar30 = 0;
      do {
        psVar23 = psVar40;
        if (hash < psVar40) {
          psVar23 = hash;
        }
        psVar25 = (secp256k1_ge *)0x0;
        if (uVar30 == 0) {
          psVar25 = (secp256k1_ge *)psVar39;
        }
        iVar11 = (*pcVar15)(psVar14,psVar21,&sStack_2c70,psVar25,cb,psVar35,psVar23,lVar37);
        if (iVar11 == 0) {
          return;
        }
        secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_2c70,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar23);
        uVar30 = uVar30 + 1;
        lVar37 = (long)psVar40->s + lVar37;
      } while (uStack_2c90 != uVar30);
    }
  }
  return;
}

Assistant:

static void testutil_random_fe_non_zero_test(secp256k1_fe *fe) {
    do {
        testutil_random_fe_test(fe);
    } while(secp256k1_fe_is_zero(fe));
}